

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx.cpp
# Opt level: O0

int ncnn::binary_op_broadcast_20<ncnn::BinaryOp_x86_avx_functor::binary_op_rsub>
              (Mat *a,Mat *b,Mat *c,Option *opt)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [16];
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  float fVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  __m128 afVar8;
  __m128 _outp_1;
  __m128 _p1_1;
  __m128 _p_1;
  __m256 _outp;
  __m256 _p1;
  __m256 _p;
  int i;
  int size;
  float *ptr1;
  int y;
  float *outptr;
  float *ptr;
  int q;
  int elempack;
  int channels;
  int h;
  int w;
  binary_op_rsub op;
  Mat *m_2;
  Mat *m;
  Mat *m_1;
  __m256 *in_stack_fffffffffffffb00;
  __m256 *in_stack_fffffffffffffb08;
  binary_op_rsub *in_stack_fffffffffffffb10;
  float local_460 [2];
  float afStack_458 [2];
  float local_450 [2];
  float afStack_448 [2];
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  int local_3d8;
  int local_3d4;
  undefined8 local_3d0;
  undefined8 local_3c8;
  undefined8 local_3c0;
  undefined4 local_3b8;
  long local_3b0;
  undefined4 local_3a8;
  undefined4 local_3a4;
  undefined4 local_3a0;
  undefined4 local_39c;
  undefined4 local_398;
  undefined8 local_390;
  float *local_388;
  int local_37c;
  undefined8 local_378;
  undefined8 local_370;
  undefined8 local_368;
  undefined4 local_360;
  long local_358;
  undefined4 local_350;
  undefined4 local_34c;
  undefined4 local_348;
  undefined4 local_344;
  undefined4 local_340;
  undefined8 local_338;
  undefined1 (*local_330) [32];
  undefined8 local_328;
  undefined8 local_320;
  undefined8 local_318;
  undefined4 local_310;
  long local_308;
  undefined4 local_300;
  undefined4 local_2fc;
  undefined4 local_2f8;
  undefined4 local_2f4;
  undefined4 local_2f0;
  undefined8 local_2e8;
  float *local_2e0;
  int local_2d8;
  int local_2d4;
  int local_2d0;
  int local_2cc;
  int local_2c8;
  binary_op_rsub local_2c1 [9];
  long *local_2b8;
  long *local_2b0;
  long *local_2a8;
  undefined1 local_29d;
  int local_29c;
  undefined8 *local_290;
  undefined1 local_285;
  int local_284;
  undefined8 *local_278;
  undefined8 *local_270;
  undefined8 *local_268;
  undefined8 *local_250;
  undefined8 *local_248;
  undefined8 *local_240;
  undefined1 local_235;
  int local_234;
  undefined8 *local_228;
  undefined8 *local_218;
  float *local_210;
  float *local_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined1 (*local_1d0) [32];
  long local_1c8;
  undefined4 local_1bc;
  long local_1b8;
  undefined1 (*local_1b0) [32];
  undefined4 local_1a4;
  int local_1a0;
  int local_19c;
  undefined8 *local_198;
  long local_190;
  undefined4 local_184;
  long local_180;
  float *local_178;
  undefined4 local_16c;
  int local_168;
  int local_164;
  undefined8 *local_160;
  long local_158;
  undefined4 local_14c;
  long local_148;
  float *local_140;
  undefined4 local_134;
  int local_130;
  int local_12c;
  undefined8 *local_128;
  undefined4 local_11c;
  long local_118;
  undefined4 local_10c;
  long local_108;
  undefined4 local_fc;
  long local_f8;
  undefined8 *local_d8;
  undefined8 *local_c8;
  undefined8 *local_b8;
  float *local_60;
  float *local_58;
  undefined8 local_50;
  float afStack_48 [4];
  undefined1 (*local_38) [32];
  
  local_2c8 = *(int *)((long)in_RDI + 0x2c);
  local_2cc = (int)in_RDI[6];
  local_2d0 = (int)in_RDI[7];
  local_2d4 = (int)in_RDI[3];
  local_2b8 = in_RDX;
  local_2b0 = in_RSI;
  local_2a8 = in_RDI;
  for (local_2d8 = 0; local_2d8 < local_2d0; local_2d8 = local_2d8 + 1) {
    local_278 = &local_328;
    local_164 = *(int *)((long)local_2a8 + 0x2c);
    local_168 = (int)local_2a8[6];
    local_16c = *(undefined4 *)((long)local_2a8 + 0x34);
    local_2e0 = (float *)(*local_2a8 + local_2a8[8] * (long)local_2d8 * local_2a8[2]);
    local_180 = local_2a8[2];
    local_184 = (undefined4)local_2a8[3];
    local_190 = local_2a8[4];
    local_160 = &local_328;
    local_108 = (long)local_164 * (long)local_168 * local_180;
    local_268 = &local_328;
    local_250 = &local_328;
    local_228 = &local_378;
    local_19c = *(int *)((long)local_2b8 + 0x2c);
    local_1a0 = (int)local_2b8[6];
    local_1a4 = *(undefined4 *)((long)local_2b8 + 0x34);
    local_330 = (undefined1 (*) [32])(*local_2b8 + local_2b8[8] * (long)local_2d8 * local_2b8[2]);
    local_1b8 = local_2b8[2];
    local_1bc = (undefined4)local_2b8[3];
    local_1c8 = local_2b8[4];
    local_198 = &local_378;
    local_f8 = (long)local_19c * (long)local_1a0 * local_1b8;
    local_218 = &local_378;
    local_248 = &local_378;
    local_2f0 = 0;
    local_2f4 = 0;
    local_2f8 = 0;
    local_2fc = 0;
    local_310 = 0;
    local_318 = 0;
    local_320 = 0;
    local_328 = 0;
    local_fc = 0x10;
    local_10c = 0x10;
    local_234 = local_2d8;
    local_235 = 1;
    local_284 = local_2d8;
    local_285 = 1;
    local_2e8 = 0;
    local_300 = 0;
    local_378 = 0;
    local_368 = 0;
    local_360 = 0;
    local_350 = 0;
    local_34c = 0;
    local_348 = 0;
    local_344 = 0;
    local_340 = 0;
    local_338 = 0;
    local_370 = 0;
    local_1b0 = local_330;
    local_178 = local_2e0;
    local_c8 = local_248;
    local_b8 = local_250;
    local_358 = local_1c8;
    local_308 = local_190;
    for (local_37c = 0; local_37c < local_2cc; local_37c = local_37c + 1) {
      local_290 = &local_3d0;
      local_12c = *(int *)((long)local_2b0 + 0x2c);
      local_130 = (int)local_2b0[6];
      local_134 = *(undefined4 *)((long)local_2b0 + 0x34);
      local_388 = (float *)(*local_2b0 + local_2b0[8] * (long)local_2d8 * local_2b0[2]);
      local_148 = local_2b0[2];
      local_14c = (undefined4)local_2b0[3];
      local_158 = local_2b0[4];
      local_128 = &local_3d0;
      local_118 = (long)local_12c * (long)local_130 * local_148;
      local_270 = &local_3d0;
      local_240 = &local_3d0;
      local_11c = 0x10;
      local_29c = local_2d8;
      local_29d = 1;
      local_3d0 = 0;
      local_3c0 = 0;
      local_3b8 = 0;
      local_3a8 = 0;
      local_3a4 = 0;
      local_3a0 = 0;
      local_39c = 0;
      local_398 = 0;
      local_390 = 0;
      local_3c8 = 0;
      local_3d4 = local_2c8 * local_2d4;
      local_140 = local_388;
      local_d8 = local_240;
      local_3b0 = local_158;
      for (local_3d8 = 0; local_3d8 + 7 < local_3d4; local_3d8 = local_3d8 + 8) {
        local_208 = local_2e0;
        local_400 = *(undefined8 *)local_2e0;
        uStack_3f8 = *(undefined8 *)(local_2e0 + 2);
        uStack_3f0 = *(undefined8 *)(local_2e0 + 4);
        uStack_3e8 = *(undefined8 *)(local_2e0 + 6);
        local_210 = local_388;
        uVar5 = *(undefined8 *)local_388;
        uVar4 = *(undefined8 *)(local_388 + 2);
        uVar6 = *(undefined8 *)(local_388 + 4);
        uVar7 = *(undefined8 *)(local_388 + 6);
        local_420 = uVar5;
        uStack_418 = uVar4;
        uStack_410 = uVar6;
        uStack_408 = uVar7;
        BinaryOp_x86_avx_functor::binary_op_rsub::func_pack8
                  (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,in_stack_fffffffffffffb00);
        local_1d0 = local_330;
        auVar1._8_8_ = uVar4;
        auVar1._0_8_ = uVar5;
        auVar1._16_8_ = uVar6;
        auVar1._24_8_ = uVar7;
        *local_330 = auVar1;
        local_2e0 = local_2e0 + 8;
        local_388 = local_388 + 8;
        local_330 = local_330 + 1;
        local_440 = uVar5;
        uStack_438 = uVar4;
        uStack_430 = uVar6;
        uStack_428 = uVar7;
        local_200 = uVar5;
        uStack_1f8 = uVar4;
        uStack_1f0 = uVar6;
        uStack_1e8 = uVar7;
      }
      for (; local_3d8 + 3 < local_3d4; local_3d8 = local_3d8 + 4) {
        local_58 = local_2e0;
        local_450 = *(float (*) [2])local_2e0;
        afStack_448 = *(float (*) [2])(local_2e0 + 2);
        local_60 = local_388;
        local_460 = *(float (*) [2])local_388;
        uVar5 = *(undefined8 *)(local_388 + 2);
        afStack_458 = (float  [2])uVar5;
        afVar8 = BinaryOp_x86_avx_functor::binary_op_rsub::func_pack4
                           (local_2c1,(__m128 *)local_450,(__m128 *)local_460);
        local_50 = afVar8._0_8_;
        local_38 = local_330;
        auVar2._8_4_ = (float)uVar5;
        auVar2._12_4_ = SUB84(uVar5,4);
        auVar2._0_8_ = local_50;
        *(undefined1 (*) [16])*local_330 = auVar2;
        local_2e0 = local_2e0 + 4;
        local_388 = local_388 + 4;
        local_330 = (undefined1 (*) [32])(*local_330 + 0x10);
        afStack_48._0_8_ = uVar5;
      }
      for (; local_3d8 < local_3d4; local_3d8 = local_3d8 + 1) {
        fVar3 = BinaryOp_x86_avx_functor::binary_op_rsub::func(local_2c1,local_2e0,local_388);
        *(float *)*local_330 = fVar3;
        local_2e0 = local_2e0 + 1;
        local_388 = local_388 + 1;
        local_330 = (undefined1 (*) [32])(*local_330 + 4);
      }
    }
  }
  return 0;
}

Assistant:

static int binary_op_broadcast_20(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int channels = a.c;
    int elempack = a.elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = a.channel(q);
        float* outptr = c.channel(q);

        for (int y = 0; y < h; y++)
        {
            const float* ptr1 = b.channel(q);

            const int size = w * elempack;

            int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                __m512 _p1 = _mm512_loadu_ps(ptr1);
                __m512 _outp = op.func_pack16(_p, _p1);
                _mm512_storeu_ps(outptr, _outp);
                ptr += 16;
                ptr1 += 16;
                outptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _p1 = _mm256_loadu_ps(ptr1);
                __m256 _outp = op.func_pack8(_p, _p1);
                _mm256_storeu_ps(outptr, _outp);
                ptr += 8;
                ptr1 += 8;
                outptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                __m128 _p1 = _mm_loadu_ps(ptr1);
                __m128 _outp = op.func_pack4(_p, _p1);
                _mm_storeu_ps(outptr, _outp);
                ptr += 4;
                ptr1 += 4;
                outptr += 4;
            }
#endif // __SSE2__
            for (; i < size; i++)
            {
                *outptr = op.func(*ptr, *ptr1);
                ptr += 1;
                ptr1 += 1;
                outptr += 1;
            }
        }
    }

    return 0;
}